

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

int __thiscall
clunk::Node::Search<(clunk::NodeType)0,true>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  uint32_t uVar1;
  uint uVar2;
  Node *this_00;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  HashEntry *this_01;
  Move *pMVar9;
  int beta_00;
  char cVar10;
  uint uVar11;
  Move firstMove;
  uint local_5c;
  uint local_4c;
  
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  uVar11 = -alpha;
  if (0 < alpha) {
    uVar11 = alpha;
  }
  if (32000 < uVar11) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  uVar11 = -beta;
  if (0 < beta) {
    uVar11 = beta;
  }
  if (32000 < uVar11) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if ((cutNode) && (bVar3 = Move::IsValid(&this->lastMove), !bVar3)) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  _stats._48_8_ = _stats._48_8_ + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->depthChange = 0;
  this->pvCount = 0;
  bVar3 = IsDraw(this);
  iVar5 = DAT_00179a64;
  if (bVar3) {
    this->standPat = DAT_00179a64;
    return iVar5;
  }
  uVar11 = this->ply - 32000;
  if (alpha < (int)uVar11) {
    alpha = uVar11;
  }
  uVar11 = 0x7d01 - this->ply;
  if (beta <= (int)uVar11) {
    uVar11 = beta;
  }
  if (this->child == (Node *)0x0 || (int)uVar11 <= alpha) {
    return alpha;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    _stats._64_8_ = _stats._64_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  firstMove.bits = 0;
  firstMove.score = 0;
  this_01 = TranspositionTable<clunk::HashEntry>::Get
                      ((TranspositionTable<clunk::HashEntry> *)_tt,this->positionKey);
  if (this_01->key == this->positionKey) {
    _tt._8_8_ = _tt._8_8_ + 1;
    switch(this_01->flags & 7) {
    case 1:
      goto switchD_0012f760_caseD_1;
    case 2:
      goto switchD_0012f760_caseD_2;
    case 3:
      uVar1 = this_01->moveBits;
      iVar5 = HashEntry::Score(this_01,this->ply);
      Move::Init(&firstMove,uVar1,iVar5);
      iVar5 = ValidateMove<true>(this,&firstMove);
      if (iVar5 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      bVar4 = this_01->flags;
      if ((((bVar4 & 0x10) != 0) && ((uint)depth <= (uint)this_01->depth)) &&
         (firstMove.score <= alpha)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        return firstMove.score;
      }
      break;
    case 4:
      uVar1 = this_01->moveBits;
      iVar5 = HashEntry::Score(this_01,this->ply);
      Move::Init(&firstMove,uVar1,iVar5);
      iVar5 = ValidateMove<true>(this,&firstMove);
      if (iVar5 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      bVar4 = this_01->flags;
      if ((bVar4 & 0x10) == 0) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      if (((uint)depth <= (uint)this_01->depth) &&
         (firstMove.score <= alpha || (int)uVar11 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        if (firstMove.score < (int)uVar11) {
          if ((alpha < firstMove.score) &&
             ((((ulong)firstMove & 0xff00000) == 0 && this->checks == 0) &&
              (firstMove.bits & 0xf) != 3)) {
            IncHistory(&firstMove,depth);
          }
        }
        else {
          AddKiller(this,&firstMove,depth);
        }
        return firstMove.score;
      }
      break;
    case 5:
      uVar1 = this_01->moveBits;
      iVar5 = HashEntry::Score(this_01,this->ply);
      Move::Init(&firstMove,uVar1,iVar5);
      iVar5 = ValidateMove<true>(this,&firstMove);
      if (iVar5 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      bVar4 = this_01->flags;
      if ((((bVar4 & 0x10) != 0) && ((uint)depth <= (uint)this_01->depth)) &&
         ((int)uVar11 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        AddKiller(this,&firstMove,depth);
        return firstMove.score;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    iVar5 = this->depthChange;
    if (((iVar5 < 1) && (this->parent->depthChange < 1)) && ((bVar4 & 8) != 0)) {
      _stats._80_8_ = _stats._80_8_ + 1;
      iVar5 = iVar5 + 1;
      this->depthChange = iVar5;
      depth = depth + 1;
    }
  }
  else {
    iVar5 = this->depthChange;
  }
  if (iVar5 < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if ((uint)depth < 4 || ((ulong)firstMove & 0xf) != 0) {
    if (((ulong)firstMove & 0xf) == 0) {
      GenerateMoves<true,false>(this,depth);
      if (this->moveCount < 1) {
        if (this->checks == 0) {
          HashEntry::SetStalemate(this_01,this->positionKey);
          _tt._24_8_ = _tt._24_8_ + 1;
switchD_0012f760_caseD_2:
          iVar5 = DAT_00179a64;
          this->standPat = DAT_00179a64;
          return iVar5;
        }
        HashEntry::SetCheckmate(this_01,this->positionKey);
        _tt._16_8_ = _tt._16_8_ + 1;
switchD_0012f760_caseD_1:
        return this->ply + -32000;
      }
      pMVar9 = GetNextMove(this);
      Move::operator=(&firstMove,pMVar9);
      if (this->moveIndex != 1) {
        __assert_fail("moveIndex == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1023,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
    }
  }
  else {
    _stats._144_8_ = _stats._144_8_ + 1;
    iVar5 = Search<(clunk::NodeType)1,true>(this,uVar11 - 1,uVar11,depth - 2,false);
    if (this->pvCount == 0 || _stop != 0) {
      return iVar5;
    }
    if (this->moveCount < 1) {
      __assert_fail("moveCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100b,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    if (this->pvCount < 1) {
      __assert_fail("pvCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100c,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    bVar3 = Move::IsValid(this->pv);
    if (!bVar3) {
      __assert_fail("pv[0].IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100d,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    Move::operator=(&firstMove,this->pv);
    this->moveIndex = 1;
  }
  if (((this->moveCount == 1) && (this->depthChange < 1)) && (this->parent->depthChange < 1)) {
    _stats._72_8_ = _stats._72_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  Exec<true>(this,&firstMove,this->child);
  iVar5 = -uVar11;
  if ((uint)depth < 2) {
    uVar6 = QSearch<false>(this->child,iVar5,-alpha,0);
  }
  else {
    uVar6 = Search<(clunk::NodeType)0,false>(this->child,iVar5,-alpha,depth - 1,!cutNode);
  }
  Undo<true>(this,&firstMove);
  if (_stop == 0) {
    local_5c = -uVar6;
    uVar8 = this->child->depthChange;
    local_4c = ((int)uVar8 >> 0x1f & uVar8) + depth;
    UpdatePV(this,&firstMove);
    if (uVar11 != local_5c && SBORROW4(uVar11,local_5c) == (int)(uVar11 + uVar6) < 0) {
      if (SBORROW4(alpha,local_5c) == (int)(alpha + uVar6) < 0) {
        uVar6 = alpha;
        if (((firstMove.bits & 0xf) != 3 && ((ulong)firstMove & 0xff00000) == 0) &&
            this->checks == 0) {
          cVar10 = -1;
          if (-1 < (char)_hist[firstMove.bits & 0xfff]) {
            cVar10 = _hist[firstMove.bits & 0xfff];
          }
          _hist[firstMove.bits & 0xfff] = cVar10 + -1;
        }
      }
      else {
        uVar6 = local_5c;
        if ((int)uVar8 < 0) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1044,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
      }
      if (this->moveCount < 1) {
        GenerateMoves<true,false>(this,depth);
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104e,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
        if ((this->moveCount == 1) && (this->moves[0].bits != firstMove.bits)) {
          __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104f,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
      }
      if (1 < this->moveIndex) {
        __assert_fail("moveIndex <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1052,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      do {
        beta_00 = -uVar6;
        while( true ) {
          do {
            pMVar9 = GetNextMove(this);
            if (pMVar9 == (Move *)0x0) {
              if (this->moveCount < 1) {
                __assert_fail("moveCount > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10a3,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              if ((int)uVar6 < (int)local_5c) {
                __assert_fail("best <= alpha",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10a4,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              if ((int)uVar11 <= (int)uVar6) {
                __assert_fail("alpha < beta",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10a5,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              if (this->pvCount < 1) {
                return local_5c;
              }
              if ((int)local_4c < 0) {
                __assert_fail("pvDepth >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10a8,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              pMVar9 = this->pv;
              bVar3 = Move::IsValid(pMVar9);
              if (bVar3) {
                uVar11 = this->pv[0].bits;
                if (((uVar11 & 0xf) != 3 && (uVar11 & 0xff00000) == 0) && this->checks == 0) {
                  IncHistory(pMVar9,depth);
                }
                if ((int)local_5c <= alpha) {
                  if (uVar6 == alpha) {
                    HashEntry::Set(this_01,this->positionKey,pMVar9,alpha,this->ply,local_4c,3,
                                   (uint)(0 < this->depthChange) * 8 + 0x10);
                    return local_5c;
                  }
                  __assert_fail("alpha == orig_alpha",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x10b6,
                                "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                               );
                }
                if (local_4c == depth) {
                  HashEntry::Set(this_01,this->positionKey,pMVar9,local_5c,this->ply,depth,4,
                                 (uint)(0 < this->depthChange) * 8 + 0x10);
                  return local_5c;
                }
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10af,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              __assert_fail("pv[0].IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a9,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            bVar3 = Move::IsValid(pMVar9);
            if (!bVar3) {
              __assert_fail("move->IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x1059,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
          } while (firstMove.bits == pMVar9->bits);
          _stats._192_8_ = _stats._192_8_ + 1;
          Exec<true>(this,pMVar9,this->child);
          if ((uint)depth < 2) {
            iVar7 = QSearch<false>(this->child,~uVar6,beta_00,0);
          }
          else {
            iVar7 = Search<(clunk::NodeType)1,false>(this->child,~uVar6,beta_00,depth - 1U,true);
          }
          uVar8 = -iVar7;
          if ((SBORROW4(uVar6,uVar8) != (int)(uVar6 + iVar7) < 0) && (_stop == 0)) {
            this_00 = this->child;
            if (this_00->depthChange < 0) {
              __assert_fail("child->depthChange >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x1074,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            _stats._232_8_ = _stats._232_8_ + 1;
            _stats._216_8_ = _stats._216_8_ + 1;
            if ((uint)depth < 2) {
              iVar7 = QSearch<false>(this_00,iVar5,beta_00,0);
            }
            else {
              iVar7 = Search<(clunk::NodeType)0,false>(this_00,iVar5,beta_00,depth - 1U,false);
            }
            uVar8 = -iVar7;
            _stats._224_8_ =
                 _stats._224_8_ + (ulong)(SBORROW4(uVar6,uVar8) != (int)(uVar6 + iVar7) < 0);
          }
          if (this->child->depthChange <= ~depth) {
            __assert_fail("(depth + child->depthChange) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1086,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                         );
          }
          Undo<true>(this,pMVar9);
          if (_stop != 0) {
            return uVar11;
          }
          if ((int)local_5c < (int)uVar8) {
            uVar2 = this->child->depthChange;
            local_4c = ((int)uVar2 >> 0x1f & uVar2) + depth;
            UpdatePV(this,pMVar9);
            local_5c = uVar8;
            if ((int)uVar11 <= (int)uVar8) {
              if (-1 < (int)uVar2) {
                AddKiller(this,pMVar9,local_4c);
                uVar6 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar6 = uVar8;
                }
                if (31000 < uVar6) {
                  uVar11 = uVar8;
                }
                HashEntry::Set(this_01,this->positionKey,pMVar9,uVar11,this->ply,local_4c,5,
                               (uint)(0 < this->depthChange) * 8 + 0x10);
                return uVar8;
              }
              __assert_fail("pvDepth == depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x1090,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
          }
          if ((int)uVar6 < (int)uVar8) break;
          uVar8 = pMVar9->bits;
          if (((uVar8 & 0xf) != 3 && (uVar8 & 0xff00000) == 0) && this->checks == 0) {
            cVar10 = _hist[uVar8 & 0xfff];
            if (cVar10 < '\0') {
              cVar10 = -1;
            }
            _hist[uVar8 & 0xfff] = cVar10 + -1;
          }
        }
        uVar6 = uVar8;
        if (local_4c != depth) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x109b,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
      } while( true );
    }
    if ((int)uVar8 < 0) {
      __assert_fail("pvDepth == depth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x103a,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    AddKiller(this,&firstMove,local_4c);
    uVar8 = -uVar6;
    if (0 < (int)uVar6) {
      uVar8 = uVar6;
    }
    if (31000 < uVar8) {
      uVar11 = local_5c;
    }
    HashEntry::Set(this_01,this->positionKey,&firstMove,uVar11,this->ply,local_4c,5,
                   (uint)(0 < this->depthChange) * 8 + 0x10);
    uVar11 = local_5c;
  }
  return uVar11;
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }